

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin-ratelimit.hh
# Opt level: O2

void __thiscall
discordpp::
PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>
::CountedSet<unsigned_long>::erase(CountedSet<unsigned_long> *this,unsigned_long t,size_t count)

{
  iterator iVar1;
  out_of_range *this_00;
  _Base_ptr p_Var2;
  unsigned_long t_local;
  
  if (count == 0) {
    return;
  }
  t_local = t;
  iVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::find(&(this->map)._M_t,&t_local);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->map)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"Erased a key that doesn\'t exist");
  }
  else {
    p_Var2 = iVar1._M_node[1]._M_parent;
    if (count <= p_Var2) {
      this->sum = this->sum - count;
      p_Var2 = (_Base_ptr)((long)p_Var2 - count);
      iVar1._M_node[1]._M_parent = p_Var2;
      if (p_Var2 != (_Base_ptr)0x0) {
        return;
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
      ::erase(&(this->map)._M_t,&t_local);
      return;
    }
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"Erased a key by more than its value");
  }
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void erase(T t, size_t count = 1) {
            if (!count)
                return;

            auto entry = map.find(t);
            if (entry == map.end())
                throw std::out_of_range("Erased a key that doesn't exist");
            if (count > entry->second)
                throw std::out_of_range("Erased a key by more than its value");
            sum -= count;
            entry->second -= count;
            if (entry->second == 0) {
                map.erase(t);
            }
        }